

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

void __thiscall SpriteBase::SpriteBase(SpriteBase *this,PSprite *base)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
  super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
  super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Sprite)._vptr_Sprite = (_func_int **)&PTR_get_data_00157900;
  iVar1 = (*((base->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[3])();
  this->delta_x = iVar1;
  iVar1 = (*((base->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[4])();
  this->delta_y = iVar1;
  iVar1 = (*((base->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[5])();
  this->offset_x = iVar1;
  iVar1 = (*((base->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[6])();
  this->offset_y = iVar1;
  this->data = (uint8_t *)0x0;
  iVar1 = (*((base->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[1])();
  iVar2 = (*((base->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[2])();
  create(this,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  return;
}

Assistant:

SpriteBase::SpriteBase(Data::PSprite base)
  : delta_x(base->get_delta_x())
  , delta_y(base->get_delta_y())
  , offset_x(base->get_offset_x())
  , offset_y(base->get_offset_y())
  , data(nullptr) {
  create(base->get_width(), base->get_height());
}